

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# comm.c
# Opt level: O1

int color(char type,CHAR_DATA *ch,char *string)

{
  ulong uVar1;
  bool bVar2;
  char cVar3;
  int iVar4;
  size_t sVar5;
  long lVar6;
  char code [20];
  undefined8 local_38;
  
  bVar2 = is_npc(ch);
  if ((bVar2) && ((ch->act[0] & 8) == 0)) {
    return 0;
  }
  iVar4 = (int)type;
  if (0x61 < iVar4) {
    if (0x6c < iVar4) {
      switch(iVar4) {
      case 0x6d:
        local_38 = 0x6d35333b305b1b;
        break;
      default:
        goto switchD_0028062d_caseD_45;
      case 0x72:
        local_38 = 0x6d31333b305b1b;
        break;
      case 0x77:
        local_38 = 0x6d37333b305b1b;
        break;
      case 0x79:
        local_38 = 0x6d33333b305b1b;
        break;
      case 0x7b:
        local_38 = CONCAT62(local_38._2_6_,0x7b);
        break;
      case 0x7c:
        local_38._2_6_ = local_38._2_6_ & 0xffffffffff00;
        local_38 = CONCAT62(local_38._2_6_,0xd0a);
      }
      goto LAB_00280775;
    }
    if (iVar4 == 0x62) {
      local_38 = 0x6d34333b305b1b;
      goto LAB_00280775;
    }
    if (iVar4 == 99) {
      local_38 = 0x6d36333b305b1b;
      goto LAB_00280775;
    }
    if (iVar4 == 0x67) {
      local_38 = 0x6d32333b305b1b;
      goto LAB_00280775;
    }
    goto switchD_0028062d_caseD_45;
  }
  if (0x51 < iVar4) {
    if (iVar4 == 0x52) {
      local_38 = 0x6d31333b305b1b;
    }
    else if (iVar4 == 0x57) {
      local_38 = 0x6d37333b305b1b;
    }
    else {
      if (iVar4 != 0x59) goto switchD_0028062d_caseD_45;
      local_38 = 0x6d33333b305b1b;
    }
    goto LAB_0028076b;
  }
  switch(iVar4) {
  case 0x42:
    local_38 = 0x6d34333b305b1b;
    break;
  case 0x43:
    local_38 = 0x6d36333b305b1b;
    break;
  case 0x44:
    local_38 = 0x6d30333b315b1b;
    goto LAB_00280775;
  case 0x45:
  case 0x46:
  case 0x48:
  case 0x49:
  case 0x4a:
  case 0x4b:
  case 0x4c:
    goto switchD_0028062d_caseD_45;
  case 0x47:
    local_38 = 0x6d32333b305b1b;
    break;
  case 0x4d:
    local_38 = 0x6d35333b305b1b;
    break;
  default:
    if (iVar4 == 0x2a) {
      local_38 = CONCAT62(local_38._2_6_,7);
      goto LAB_00280775;
    }
    if (iVar4 == 0x2f) {
      local_38 = CONCAT62(local_38._2_6_,10);
      goto LAB_00280775;
    }
    goto switchD_0028062d_caseD_45;
  }
LAB_0028076b:
  local_38 = local_38 | 0x10000;
LAB_00280775:
  if ((char)local_38 != '\0') {
    lVar6 = 1;
    cVar3 = (char)local_38;
    do {
      string[lVar6 + -1] = cVar3;
      string[lVar6] = '\0';
      cVar3 = *(char *)((long)&local_38 + lVar6);
      lVar6 = lVar6 + 1;
    } while (cVar3 != '\0');
  }
  sVar5 = strlen((char *)&local_38);
  return (int)sVar5;
switchD_0028062d_caseD_45:
  uVar1 = local_38 >> 0x20;
  local_38 = CONCAT44((uint)uVar1 & 0xffffff00,0x6d305b1b);
  goto LAB_00280775;
}

Assistant:

int color(char type, CHAR_DATA *ch, char *string)
{
	char code[20];
	char *p = (char *)'\0';

	if (is_npc(ch) && !IS_SET(ch->act, ACT_WARD_MOB))
		return 0;

	switch (type)
	{
		case 'x':
			sprintf(code, CLEAR);
			break;
		case 'b':
			sprintf(code, C_BLUE);
			break;
		case 'c':
			sprintf(code, C_CYAN);
			break;
		case 'g':
			sprintf(code, C_GREEN);
			break;
		case 'm':
			sprintf(code, C_MAGENTA);
			break;
		case 'r':
			sprintf(code, C_RED);
			break;
		case 'w':
			sprintf(code, C_WHITE);
			break;
		case 'y':
			sprintf(code, C_YELLOW);
			break;
		case 'B':
			sprintf(code, C_B_BLUE);
			break;
		case 'C':
			sprintf(code, C_B_CYAN);
			break;
		case 'G':
			sprintf(code, C_B_GREEN);
			break;
		case 'M':
			sprintf(code, C_B_MAGENTA);
			break;
		case 'R':
			sprintf(code, C_B_RED);
			break;
		case 'W':
			sprintf(code, C_B_WHITE);
			break;
		case 'Y':
			sprintf(code, C_B_YELLOW);
			break;
		case 'D':
			sprintf(code, C_D_GREY);
			break;
		case '*':
			sprintf(code, "%c", 007);
			break;
		case '/':
			sprintf(code, "%c", 012);
			break;
		case '{':
			sprintf(code, "%c", '{');
			break;
		case '|':
			sprintf(code, "\n\r");
			break;
		default:
			sprintf(code, CLEAR);
			break;
	}

	p = code;

	while (*p != '\0')
	{
		*string = *p++;
		*++string = '\0';
	}

	return strlen(code);
}